

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCache
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmState *this_00;
  long lVar1;
  _Base_ptr p_Var2;
  pointer pbVar3;
  bool bVar4;
  CacheEntryType type;
  Value *pVVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  ulong uVar7;
  char *pcVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar11;
  _Base_ptr propertyName;
  const_iterator cVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  Value entry;
  Value props;
  Value result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allKeys;
  Value list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  ValueHolder local_1f8;
  long local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  ValueHolder local_1d0;
  undefined1 local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  ValueHolder local_1a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_180 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  if ((int)this->m_State < 2) {
    local_1a8[0].string_ = (char *)&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"This project was not configured yet.","");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
    if (local_1a8[0] != &local_198) {
      operator_delete(local_1a8[0].string_,local_198._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = ((this->super_cmServerProtocol).m_CMakeInstance._M_t.
               super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
               super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State;
    Json::Value::Value((Value *)local_1a8,objectValue);
    cmState::GetCacheEntryKeys_abi_cxx11_(&local_168,this_00);
    Json::Value::Value(&local_148,arrayValue);
    pVVar5 = Json::Value::operator[](&request->Data,&kKEYS_KEY_abi_cxx11_);
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar12 = Json::Value::begin(pVVar5);
    local_1d0.int_ = (LargestInt)cVar12.super_ValueIteratorBase.current_._M_node;
    local_1c8 = cVar12.super_ValueIteratorBase.isNull_;
    cVar12 = Json::Value::end(pVVar5);
    local_180._0_8_ = cVar12.super_ValueIteratorBase.current_._M_node;
    local_180[8] = cVar12.super_ValueIteratorBase.isNull_;
    while (bVar4 = Json::ValueIteratorBase::isEqual
                             ((ValueIteratorBase *)&local_1d0,(SelfType *)local_180),
          pbVar11 = local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, !bVar4) {
      pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&local_1d0);
      Json::Value::asString_abi_cxx11_((string *)&local_1f8,pVVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
      }
      Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_1d0);
    }
    __rhs = local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_218,&local_168);
    }
    else {
      do {
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_168.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_168.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__rhs);
        if (_Var6._M_current ==
            local_168.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1d0,"Key \"",__rhs);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d0.int_);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar10) {
            local_1e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_1e8._8_8_ = plVar9[3];
            local_1f8.string_ = (char *)&local_1e8;
          }
          else {
            local_1e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_1f8.string_ = ((char *)*plVar9).string_;
          }
          local_1f0 = plVar9[1];
          *plVar9 = (long)paVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_1f8);
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0.string_,local_1c0._M_allocated_capacity + 1);
          }
          goto LAB_00468927;
        }
        __rhs = __rhs + 1;
      } while (__rhs != pbVar11);
    }
    pbVar3 = local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar11 = local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar7 = (long)local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar1 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar11,pbVar3);
      local_150 = local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_218.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_218.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar11 = local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          Json::Value::Value((Value *)&local_1f8,objectValue);
          Json::Value::Value(&local_a8,pbVar11);
          pVVar5 = Json::Value::operator[]((Value *)&local_1f8,&kKEY_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_a8);
          Json::Value::~Value(&local_a8);
          type = cmState::GetCacheEntryType(this_00,pbVar11);
          pcVar8 = cmState::CacheEntryTypeToString(type);
          Json::Value::Value(&local_d0,pcVar8);
          pVVar5 = Json::Value::operator[]((Value *)&local_1f8,&kTYPE_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_d0);
          Json::Value::~Value(&local_d0);
          pcVar8 = cmState::GetCacheEntryValue(this_00,pbVar11);
          Json::Value::Value(&local_58,pcVar8);
          pVVar5 = Json::Value::operator[]((Value *)&local_1f8,&kVALUE_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_58);
          Json::Value::~Value(&local_58);
          Json::Value::Value((Value *)&local_1d0,objectValue);
          cmState::GetCacheEntryPropertyList
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_180,this_00,pbVar11);
          p_Var2 = (_Base_ptr)CONCAT71(local_180._9_7_,local_180[8]);
          propertyName = (_Base_ptr)local_180._0_8_;
          if ((_Base_ptr)local_180._0_8_ == p_Var2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_180);
          }
          else {
            do {
              pcVar8 = cmState::GetCacheEntryProperty(this_00,pbVar11,(string *)propertyName);
              Json::Value::Value(&local_80,pcVar8);
              pVVar5 = Json::Value::operator[]((Value *)&local_1d0,(string *)propertyName);
              Json::Value::operator=(pVVar5,&local_80);
              Json::Value::~Value(&local_80);
              propertyName = propertyName + 1;
            } while (propertyName != p_Var2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_180);
            Json::Value::Value(&local_f8,(Value *)&local_1d0);
            pVVar5 = Json::Value::operator[]((Value *)&local_1f8,&kPROPERTIES_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar5,&local_f8);
            Json::Value::~Value(&local_f8);
          }
          Json::Value::append(&local_148,(Value *)&local_1f8);
          Json::Value::~Value((Value *)&local_1d0);
          Json::Value::~Value((Value *)&local_1f8);
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != local_150);
      }
    }
    Json::Value::Value(&local_120,&local_148);
    pVVar5 = Json::Value::operator[]((Value *)local_1a8,&kCACHE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_120);
    Json::Value::~Value(&local_120);
    cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)local_1a8);
LAB_00468927:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    Json::Value::~Value(&local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168);
    Json::Value::~Value((Value *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCache(
  const cmServerRequest& request)
{
  if (this->m_State < STATE_CONFIGURED) {
    return request.ReportError("This project was not configured yet.");
  }

  cmState* state = this->CMakeInstance()->GetState();

  Json::Value result = Json::objectValue;

  std::vector<std::string> allKeys = state->GetCacheEntryKeys();

  Json::Value list = Json::arrayValue;
  std::vector<std::string> keys = toStringList(request.Data[kKEYS_KEY]);
  if (keys.empty()) {
    keys = allKeys;
  } else {
    for (const auto& i : keys) {
      if (std::find(allKeys.begin(), allKeys.end(), i) == allKeys.end()) {
        return request.ReportError("Key \"" + i + "\" not found in cache.");
      }
    }
  }
  std::sort(keys.begin(), keys.end());
  for (const auto& key : keys) {
    Json::Value entry = Json::objectValue;
    entry[kKEY_KEY] = key;
    entry[kTYPE_KEY] =
      cmState::CacheEntryTypeToString(state->GetCacheEntryType(key));
    entry[kVALUE_KEY] = state->GetCacheEntryValue(key);

    Json::Value props = Json::objectValue;
    bool haveProperties = false;
    for (const auto& prop : state->GetCacheEntryPropertyList(key)) {
      haveProperties = true;
      props[prop] = state->GetCacheEntryProperty(key, prop);
    }
    if (haveProperties) {
      entry[kPROPERTIES_KEY] = props;
    }

    list.append(entry);
  }

  result[kCACHE_KEY] = list;
  return request.Reply(result);
}